

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeKernelSetGlobalOffsetExp
          (ze_kernel_handle_t hKernel,uint32_t offsetX,uint32_t offsetY,uint32_t offsetZ)

{
  ze_pfnKernelSetGlobalOffsetExp_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnKernelSetGlobalOffsetExp_t pfnSetGlobalOffsetExp;
  uint32_t offsetZ_local;
  uint32_t offsetY_local;
  uint32_t offsetX_local;
  ze_kernel_handle_t hKernel_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->KernelExp).pfnSetGlobalOffsetExp;
    if (p_Var1 == (ze_pfnKernelSetGlobalOffsetExp_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hKernel_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hKernel_local._4_4_ = (*p_Var1)(hKernel,offsetX,offsetY,offsetZ);
    }
  }
  else {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hKernel_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeKernelSetGlobalOffsetExp(
    ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
    uint32_t offsetX,                               ///< [in] global offset for X dimension to use for this kernel
    uint32_t offsetY,                               ///< [in] global offset for Y dimension to use for this kernel
    uint32_t offsetZ                                ///< [in] global offset for Z dimension to use for this kernel
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnKernelSetGlobalOffsetExp_t pfnSetGlobalOffsetExp = [&result] {
        auto pfnSetGlobalOffsetExp = ze_lib::context->zeDdiTable.load()->KernelExp.pfnSetGlobalOffsetExp;
        if( nullptr == pfnSetGlobalOffsetExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetGlobalOffsetExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetGlobalOffsetExp( hKernel, offsetX, offsetY, offsetZ );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetGlobalOffsetExp = ze_lib::context->zeDdiTable.load()->KernelExp.pfnSetGlobalOffsetExp;
    if( nullptr == pfnSetGlobalOffsetExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetGlobalOffsetExp( hKernel, offsetX, offsetY, offsetZ );
    #endif
}